

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3InitCallback(void *pInit,int argc,char **argv,char **NotUsed)

{
  u8 uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  Index *pIndex_00;
  char *in_RCX;
  sqlite3 *in_RDX;
  long *in_RDI;
  long in_FS_OFFSET;
  Index *pIndex;
  u8 saved_iDb;
  int rc;
  int iDb;
  sqlite3 *db;
  InitData *pData;
  sqlite3_stmt *pStmt;
  char **in_stack_00000190;
  sqlite3 *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  char **in_stack_ffffffffffffff98;
  InitData *in_stack_ffffffffffffffa0;
  undefined4 uVar5;
  undefined4 uVar6;
  Vdbe *pReprepare;
  int local_14;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pReprepare = (Vdbe *)*in_RDI;
  uVar6 = (undefined4)in_RDI[2];
  pReprepare->cacheCtr = pReprepare->cacheCtr | 0x40;
  if (in_RDX == (sqlite3 *)0x0) {
    local_14 = 0;
  }
  else {
    *(int *)((long)in_RDI + 0x1c) = *(int *)((long)in_RDI + 0x1c) + 1;
    if (*(char *)((long)&pReprepare->nStmtDefImmCons + 7) == '\0') {
      if (in_RDX->mutex == (sqlite3_mutex *)0x0) {
        corruptSchema(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90)
        ;
      }
      else if (((in_RDX->aDb == (Db *)0x0) || (""[*(byte *)&in_RDX->aDb->zDbSName] != 'c')) ||
              (""[*(byte *)((long)&in_RDX->aDb->zDbSName + 1)] != 'r')) {
        if ((in_RDX->pVdbe == (Vdbe *)0x0) ||
           ((in_RDX->aDb != (Db *)0x0 && (*(char *)&in_RDX->aDb->zDbSName != '\0')))) {
          corruptSchema(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                        in_stack_ffffffffffffff90);
        }
        else {
          pIndex_00 = sqlite3FindIndex((sqlite3 *)&DAT_aaaaaaaaaaaaaaaa,
                                       (char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
          if (pIndex_00 == (Index *)0x0) {
            corruptSchema((InitData *)0x0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
          }
          else {
            iVar4 = sqlite3GetUInt32((char *)in_RDX->mutex,&pIndex_00->tnum);
            if ((((iVar4 == 0) || (pIndex_00->tnum < 2)) ||
                ((*(uint *)(in_RDI + 4) < pIndex_00->tnum ||
                 (iVar4 = sqlite3IndexHasDuplicateRootPage(pIndex_00), iVar4 != 0)))) &&
               (sqlite3Config.bExtraSchemaChecks != '\0')) {
              corruptSchema((InitData *)pIndex_00,in_stack_ffffffffffffff98,
                            in_stack_ffffffffffffff90);
            }
          }
        }
      }
      else {
        uVar5 = 0xaaaaaaaa;
        uVar1 = pReprepare->errorAction;
        pReprepare->errorAction = (u8)uVar6;
        iVar4 = sqlite3GetUInt32((char *)in_RDX->mutex,(u32 *)&pReprepare->nResColumn);
        if (((iVar4 == 0) ||
            ((uVar2._0_2_ = pReprepare->nResColumn, uVar2._2_2_ = pReprepare->nResAlloc,
             *(uint *)(in_RDI + 4) < uVar2 && ((int)in_RDI[4] != 0)))) &&
           (sqlite3Config.bExtraSchemaChecks != '\0')) {
          corruptSchema(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                        in_stack_ffffffffffffff90);
        }
        pReprepare->prepFlags = pReprepare->prepFlags & 0xfe;
        *(sqlite3 **)&pReprepare->field_0xc8 = in_RDX;
        sqlite3Prepare(in_RDX,in_RCX,(int)((ulong)in_RDI >> 0x20),(u32)in_RDI,pReprepare,
                       (sqlite3_stmt **)CONCAT44(uVar6,uVar5),in_stack_00000190);
        uVar2 = (uint)pReprepare->nFkConstraint;
        pReprepare->errorAction = uVar1;
        if ((uVar2 != 0) && ((pReprepare->prepFlags & 1) == 0)) {
          if (*(int *)((long)in_RDI + 0x14) < (int)uVar2) {
            *(uint *)((long)in_RDI + 0x14) = uVar2;
          }
          if (uVar2 == 7) {
            sqlite3OomFault(in_stack_ffffffffffffff80);
          }
          else if ((uVar2 != 9) && ((uVar2 & 0xff) != 6)) {
            sqlite3_errmsg((sqlite3 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
            ;
            corruptSchema(in_stack_ffffffffffffffa0,(char **)in_RDX,(char *)in_RDI);
          }
        }
        *(char ***)&pReprepare->field_0xc8 = sqlite3StdType;
        sqlite3_finalize((sqlite3_stmt *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      }
      local_14 = 0;
    }
    else {
      corruptSchema(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      local_14 = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3InitCallback(void *pInit, int argc, char **argv, char **NotUsed){
  InitData *pData = (InitData*)pInit;
  sqlite3 *db = pData->db;
  int iDb = pData->iDb;

  assert( argc==5 );
  UNUSED_PARAMETER2(NotUsed, argc);
  assert( sqlite3_mutex_held(db->mutex) );
  db->mDbFlags |= DBFLAG_EncodingFixed;
  if( argv==0 ) return 0;   /* Might happen if EMPTY_RESULT_CALLBACKS are on */
  pData->nInitRow++;
  if( db->mallocFailed ){
    corruptSchema(pData, argv, 0);
    return 1;
  }

  assert( iDb>=0 && iDb<db->nDb );
  if( argv[3]==0 ){
    corruptSchema(pData, argv, 0);
  }else if( argv[4]
         && 'c'==sqlite3UpperToLower[(unsigned char)argv[4][0]]
         && 'r'==sqlite3UpperToLower[(unsigned char)argv[4][1]] ){
    /* Call the parser to process a CREATE TABLE, INDEX or VIEW.
    ** But because db->init.busy is set to 1, no VDBE code is generated
    ** or executed.  All the parser does is build the internal data
    ** structures that describe the table, index, or view.
    **
    ** No other valid SQL statement, other than the variable CREATE statements,
    ** can begin with the letters "C" and "R".  Thus, it is not possible run
    ** any other kind of statement while parsing the schema, even a corrupt
    ** schema.
    */
    int rc;
    u8 saved_iDb = db->init.iDb;
    sqlite3_stmt *pStmt;
    TESTONLY(int rcp);            /* Return code from sqlite3_prepare() */

    assert( db->init.busy );
    db->init.iDb = iDb;
    if( sqlite3GetUInt32(argv[3], &db->init.newTnum)==0
     || (db->init.newTnum>pData->mxPage && pData->mxPage>0)
    ){
      if( sqlite3Config.bExtraSchemaChecks ){
        corruptSchema(pData, argv, "invalid rootpage");
      }
    }
    db->init.orphanTrigger = 0;
    db->init.azInit = (const char**)argv;
    pStmt = 0;
    TESTONLY(rcp = ) sqlite3Prepare(db, argv[4], -1, 0, 0, &pStmt, 0);
    rc = db->errCode;
    assert( (rc&0xFF)==(rcp&0xFF) );
    db->init.iDb = saved_iDb;
    /* assert( saved_iDb==0 || (db->mDbFlags & DBFLAG_Vacuum)!=0 ); */
    if( SQLITE_OK!=rc ){
      if( db->init.orphanTrigger ){
        assert( iDb==1 );
      }else{
        if( rc > pData->rc ) pData->rc = rc;
        if( rc==SQLITE_NOMEM ){
          sqlite3OomFault(db);
        }else if( rc!=SQLITE_INTERRUPT && (rc&0xFF)!=SQLITE_LOCKED ){
          corruptSchema(pData, argv, sqlite3_errmsg(db));
        }
      }
    }
    db->init.azInit = sqlite3StdType; /* Any array of string ptrs will do */
    sqlite3_finalize(pStmt);
  }else if( argv[1]==0 || (argv[4]!=0 && argv[4][0]!=0) ){
    corruptSchema(pData, argv, 0);
  }else{
    /* If the SQL column is blank it means this is an index that
    ** was created to be the PRIMARY KEY or to fulfill a UNIQUE
    ** constraint for a CREATE TABLE.  The index should have already
    ** been created when we processed the CREATE TABLE.  All we have
    ** to do here is record the root page number for that index.
    */
    Index *pIndex;
    pIndex = sqlite3FindIndex(db, argv[1], db->aDb[iDb].zDbSName);
    if( pIndex==0 ){
      corruptSchema(pData, argv, "orphan index");
    }else
    if( sqlite3GetUInt32(argv[3],&pIndex->tnum)==0
     || pIndex->tnum<2
     || pIndex->tnum>pData->mxPage
     || sqlite3IndexHasDuplicateRootPage(pIndex)
    ){
      if( sqlite3Config.bExtraSchemaChecks ){
        corruptSchema(pData, argv, "invalid rootpage");
      }
    }
  }
  return 0;
}